

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitTypedArrayIndex
          (AsmJSByteCodeGenerator *this,ParseNode *indexNode,OpCodeAsmJs *op,uint32 *indexSlot,
          ViewType viewType,TypedArrayEmitType emitType)

{
  undefined1 *puVar1;
  AsmJsModuleCompiler *pAVar2;
  ParseNode *this_00;
  code *pcVar3;
  AsmJSByteCodeGenerator *pAVar4;
  OpCode OVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  IdentPtr pIVar9;
  AsmJsSymbol *pAVar10;
  AsmJsVar *pAVar11;
  ParseNodeInt *pPVar12;
  ParseNodeBin *pPVar13;
  ParseNodeFloat *pPVar14;
  EmitExpressionInfo EVar15;
  undefined4 *puVar16;
  char16 *pcVar17;
  AsmJsCompilationException *this_01;
  uint uVar18;
  TypedArrayEmitType TVar19;
  undefined3 in_register_00000081;
  uint uVar20;
  ulong uVar21;
  EmitExpressionInfo local_60;
  EmitExpressionInfo indexInfo;
  EmitExpressionInfo local_50;
  uint local_44;
  AsmJSByteCodeGenerator *local_40;
  uint local_38;
  TypedArrayEmitType local_34;
  
  local_44 = CONCAT31(in_register_00000081,viewType);
  puVar1 = &this->mCompiler->field_0x2e4;
  *puVar1 = *puVar1 | 0x10;
  OVar5 = indexNode->nop;
  uVar21 = 0;
  bVar6 = false;
  local_40 = this;
  if (OVar5 == knopName) {
    pAVar2 = this->mCompiler;
    local_34 = emitType;
    pIVar9 = ParseNode::name(indexNode);
    uVar21 = 0;
    pAVar10 = AsmJsModuleCompiler::LookupIdentifier(pAVar2,pIVar9,this->mFunction,(Source *)0x0);
    if (pAVar10 == (AsmJsSymbol *)0x0) {
      bVar6 = false;
    }
    else {
      uVar21 = 0;
      bVar6 = false;
      if (pAVar10->mType == Variable) {
        iVar7 = (*pAVar10->_vptr_AsmJsSymbol[1])(pAVar10);
        uVar21 = 0;
        bVar6 = false;
        if ((char)iVar7 == '\0') {
          pAVar11 = AsmJsVar::FromSymbol(pAVar10);
          uVar21 = 0;
          bVar6 = false;
          if ((pAVar11->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14 == '\0') {
            uVar21 = (ulong)(uint)(pAVar11->mConstInitialiser).intVal;
            bVar6 = true;
          }
        }
      }
    }
    OVar5 = indexNode->nop;
    emitType = local_34;
  }
  uVar20 = (uint)uVar21;
  if ((OVar5 == knopInt) || (OVar5 == knopFlt)) {
    if (!bVar6) {
      if (OVar5 == knopFlt) {
        pPVar14 = ParseNode::AsParseNodeFloat(indexNode);
        if ((pPVar14->field_0x18 & 1) != 0) {
          pPVar14 = ParseNode::AsParseNodeFloat(indexNode);
          uVar21 = 0x80000000;
          if ((pPVar14->dbl == -2147483648.0) && (!NAN(pPVar14->dbl))) goto LAB_0093b8c3;
        }
      }
      else if (OVar5 == knopInt) {
        pPVar12 = ParseNode::AsParseNodeInt(indexNode);
        uVar21 = (ulong)(uint)pPVar12->lw;
        goto LAB_0093b8c3;
      }
      if ((((indexNode->nop != knopFlt) ||
           (pPVar14 = ParseNode::AsParseNodeFloat(indexNode), (pPVar14->field_0x18 & 1) == 0)) ||
          (pPVar14 = ParseNode::AsParseNodeFloat(indexNode), pPVar14->dbl <= 2147483647.0)) ||
         (pPVar14 = ParseNode::AsParseNodeFloat(indexNode), 4294967295.0 < pPVar14->dbl)) {
        local_60 = Emit(local_40,indexNode);
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        pcVar17 = AsmJsType::toChars(&local_60.type);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"Array Index must be intish; %s given",pcVar17);
        goto LAB_0093bc83;
      }
      pPVar14 = ParseNode::AsParseNodeFloat(indexNode);
      uVar21 = (ulong)pPVar14->dbl;
    }
  }
  else if (!bVar6) {
    local_50.super_EmitInfoBase.location = 0xffffffff;
    if (1 < (byte)local_44 && OVar5 != knopRsh) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"index expression isn\'t shifted; must be an Int8/Uint8 access");
      goto LAB_0093bc83;
    }
    local_38 = 0xffffffff;
    indexInfo = (EmitExpressionInfo)indexSlot;
    local_34 = emitType;
    if (OVar5 == knopRsh) {
      pPVar13 = ParseNode::AsParseNodeBin(indexNode);
      this_00 = pPVar13->pnode2;
      if ((this_00 == (ParseNode *)0x0) || (this_00->nop != knopInt)) {
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"shift amount must be constant");
        goto LAB_0093bc83;
      }
      if ((byte)local_44 < 0xf) {
        uVar8 = (local_44 & 0xff) << 2;
        uVar18 = *(uint *)(&DAT_010ea9b0 + uVar8);
        local_38 = *(uint *)(&DAT_010ea9ec + uVar8);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x63e,"((0))","(0)");
        if (!bVar6) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar16 = 0;
        local_38 = 0xffffffff;
        uVar18 = 0;
      }
      pPVar12 = ParseNode::AsParseNodeInt(this_00);
      if (pPVar12->lw != uVar18) {
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"shift amount must be %d",(ulong)uVar18);
        goto LAB_0093bc83;
      }
      pPVar13 = ParseNode::AsParseNodeBin(indexNode);
      indexNode = pPVar13->pnode1;
      OVar5 = indexNode->nop;
    }
    pAVar4 = local_40;
    if (OVar5 == knopName) {
      pAVar2 = local_40->mCompiler;
      pIVar9 = ParseNode::name(indexNode);
      pAVar10 = AsmJsModuleCompiler::LookupIdentifier(pAVar2,pIVar9,pAVar4->mFunction,(Source *)0x0)
      ;
      if (((pAVar10 == (AsmJsSymbol *)0x0) || (pAVar10->mType != Variable)) ||
         ((iVar7 = (*pAVar10->_vptr_AsmJsSymbol[1])(pAVar10), (char)iVar7 != '\0' ||
          (pAVar11 = AsmJsVar::FromSymbol(pAVar10), TVar19 = local_34,
          (pAVar11->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14 != '\0')))) {
        bVar6 = false;
        TVar19 = local_34;
      }
      else {
        uVar20 = (pAVar11->mConstInitialiser).intVal & local_38;
        *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)local_34 * 4);
        AsmJsModuleCompiler::UpdateMaxHeapAccess(local_40->mCompiler,uVar20);
        bVar6 = true;
      }
      OVar5 = indexNode->nop;
    }
    else {
      bVar6 = false;
      TVar19 = local_34;
    }
    if ((OVar5 != knopInt) &&
       ((((OVar5 != knopFlt ||
          (pPVar14 = ParseNode::AsParseNodeFloat(indexNode), (pPVar14->field_0x18 & 1) == 0)) ||
         (pPVar14 = ParseNode::AsParseNodeFloat(indexNode), pPVar14->dbl <= 2147483647.0)) ||
        (pPVar14 = ParseNode::AsParseNodeFloat(indexNode), 4294967295.0 < pPVar14->dbl)))) {
      EVar15 = indexInfo;
      indexSlot = (uint32 *)indexInfo;
      if (bVar6) goto LAB_0093b930;
      local_50 = Emit(local_40,indexNode);
      bVar6 = AsmJsType::isIntish(&local_50.type);
      if (bVar6) {
        *(RegSlot *)EVar15 = local_50.super_EmitInfoBase.location;
        *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)TVar19 * 4 + 2);
        return local_50;
      }
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      pcVar17 = AsmJsType::toChars(&local_50.type);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Left operand of >> must be intish; %s given",pcVar17);
      goto LAB_0093bc83;
    }
    uVar20 = ParserWrapper::GetUInt(indexNode);
    uVar20 = uVar20 & local_38;
    *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)TVar19 * 4);
    AsmJsModuleCompiler::UpdateMaxHeapAccess(local_40->mCompiler,uVar20);
    indexSlot = (uint32 *)indexInfo;
    goto LAB_0093b930;
  }
LAB_0093b8c3:
  uVar20 = (uint)uVar21;
  if ((local_44 & 0xff) - 4 < 3) {
    if (0x3fffffff < uVar20) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap32 must be within 0 <= n < 2^30; %d given",
                 uVar21 & 0xffffffff);
LAB_0093bc83:
      __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
    }
    uVar20 = uVar20 << 2;
  }
  else if ((local_44 & 0xff) - 2 < 2) {
    if ((int)uVar20 < 0) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap16 must be within 0 <= n < 2^31; %d given",
                 uVar21 & 0xffffffff);
      goto LAB_0093bc83;
    }
    uVar20 = uVar20 * 2;
  }
  else if ((byte)local_44 == '\a') {
    if (0x1fffffff < uVar20) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap64 must be within 0 <= n < 2^29; %d given",
                 uVar21 & 0xffffffff);
      goto LAB_0093bc83;
    }
    uVar20 = uVar20 << 3;
  }
  AsmJsModuleCompiler::UpdateMaxHeapAccess(local_40->mCompiler,uVar20);
  *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)emitType * 4);
LAB_0093b930:
  *indexSlot = uVar20;
  EVar15.super_EmitInfoBase.location = 0xffffffff;
  EVar15.type.which_ = Void;
  return EVar15;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitTypedArrayIndex(ParseNode* indexNode, OpCodeAsmJs &op, uint32 &indexSlot, ArrayBufferView::ViewType viewType, TypedArrayEmitType emitType)
    {
        mCompiler->SetUsesHeapBuffer(true);
        bool isConst = false;
        uint32 slot = 0;
        if(indexNode->nop == knopName)
        {
            AsmJsSymbol * declSym = mCompiler->LookupIdentifier(indexNode->name(), mFunction);
            if (AsmJsVar::Is(declSym) && !declSym->isMutable())
            {
                AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                if(definition->GetVarType().isInt())
                {
                    slot = (uint32)definition->GetIntInitialiser();
                    isConst = true;
                }
            }
        }
        if (indexNode->nop == knopInt || indexNode->nop == knopFlt || isConst)
        {
            // Emit a different opcode for numerical literal
            if (!isConst)
            {
                if (indexNode->nop == knopInt)
                {
                    slot = (uint32)indexNode->AsParseNodeInt()->lw;
                }
                else if (ParserWrapper::IsMinInt(indexNode))
                {
                    // this is going to be an error, but we can do this to allow it to get same error message as invalid int
                    slot = (uint32)INT32_MIN;
                }
                else if (ParserWrapper::IsUnsigned(indexNode))
                {
                    slot = (uint32)indexNode->AsParseNodeFloat()->dbl;
                }
                else
                {
                    EmitExpressionInfo indexInfo = Emit(indexNode);
                    throw AsmJsCompilationException(_u("Array Index must be intish; %s given"), indexInfo.type.toChars());
                }
            }
            // do the right shift now
            switch( viewType )
            {
            case Js::ArrayBufferView::TYPE_INT16:
            case Js::ArrayBufferView::TYPE_UINT16:
                if (slot & 0x80000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap16 must be within 0 <= n < 2^31; %d given"), slot);
                }
                slot <<= 1;
                break;
            case Js::ArrayBufferView::TYPE_INT32:
            case Js::ArrayBufferView::TYPE_UINT32:
            case Js::ArrayBufferView::TYPE_FLOAT32:
                if (slot & 0xC0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap32 must be within 0 <= n < 2^30; %d given"), slot);
                }
                slot <<= 2;
                break;
            case Js::ArrayBufferView::TYPE_FLOAT64:
                if (slot & 0xE0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap64 must be within 0 <= n < 2^29; %d given"), slot);
                }
                slot <<= 3;
                break;
            default:
                break;
            }
            mCompiler->UpdateMaxHeapAccess(slot);
            op = typedArrayOp[emitType][0];
        }
        else
        {
            EmitExpressionInfo indexInfo;
            if (indexNode->nop != knopRsh && viewType != Js::ArrayBufferView::TYPE_INT8 && viewType != Js::ArrayBufferView::TYPE_UINT8)
            {
                throw AsmJsCompilationException( _u("index expression isn't shifted; must be an Int8/Uint8 access") );
            }
            int val = 0;
            uint32 mask = (uint32)~0;
            ParseNode* index;
            if (indexNode->nop == knopRsh)
            {
                ParseNode* rhsNode = ParserWrapper::GetBinaryRight(indexNode);
                if (!rhsNode || rhsNode->nop != knopInt)
                {
                    throw AsmJsCompilationException(_u("shift amount must be constant"));
                }
                switch (viewType)
                {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, irSuffix) \
                case Js::ArrayBufferView::TYPE_##name:\
                    val = align;\
                    mask = ARRAYBUFFER_VIEW_MASK(align);\
                    break;
                #include "AsmJsArrayBufferViews.h"
                default:
                    Assume(UNREACHED);
                }
                if (rhsNode->AsParseNodeInt()->lw != val)
                {
                    throw AsmJsCompilationException(_u("shift amount must be %d"), val);
                }
                index = ParserWrapper::GetBinaryLeft(indexNode);
            }
            else
            {
                index = indexNode;
            }

            isConst = false;
            if (index->nop == knopName)
            {
                AsmJsSymbol * declSym = mCompiler->LookupIdentifier(index->name(), mFunction);
                if (AsmJsVar::Is(declSym) && !declSym->isMutable())
                {
                    AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                    if (definition->GetVarType().isInt())
                    {
                        slot = (uint32)definition->GetIntInitialiser();
                        slot &= mask;
                        op = typedArrayOp[emitType][0];
                        isConst = true;
                        mCompiler->UpdateMaxHeapAccess(slot);
                    }
                }
            }
            if( ParserWrapper::IsUInt( index) )
            {
                slot = ParserWrapper::GetUInt(index);
                slot &= mask;
                op = typedArrayOp[emitType][0];

                mCompiler->UpdateMaxHeapAccess(slot);
            }
            else if (!isConst)
            {
                indexInfo = Emit( index );
                if( !indexInfo.type.isIntish() )
                {
                    throw AsmJsCompilationException( _u("Left operand of >> must be intish; %s given"), indexInfo.type.toChars() );
                }
                indexSlot = indexInfo.location;
                op = typedArrayOp[emitType][1];
                return indexInfo;
            }
        }
        indexSlot = slot;
        return EmitExpressionInfo();
    }